

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O0

Cnf_Dat_t * Cnf_DeriveSimple(Aig_Man_t *p,int nOutputs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Cnf_Dat_t *__s;
  int **ppiVar7;
  int *piVar8;
  void *pvVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  int local_d8;
  int Number;
  int nClauses;
  int nLiterals;
  int i;
  int **pClas;
  int *pLits;
  int pVars [32];
  int PoVar;
  int OutVar;
  Cnf_Dat_t *pCnf;
  Aig_Obj_t *pObj;
  int nOutputs_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManNodeNum(p);
  iVar2 = Aig_ManCoNum(p);
  iVar1 = iVar1 * 7 + 1 + iVar2 + nOutputs * 3;
  iVar2 = Aig_ManNodeNum(p);
  iVar3 = Aig_ManCoNum(p);
  iVar2 = iVar2 * 3 + 1 + iVar3 + nOutputs;
  __s = (Cnf_Dat_t *)malloc(0x48);
  memset(__s,0,0x48);
  __s->pMan = p;
  __s->nLiterals = iVar1;
  __s->nClauses = iVar2;
  ppiVar7 = (int **)malloc((long)(iVar2 + 1) << 3);
  __s->pClauses = ppiVar7;
  piVar8 = (int *)malloc((long)iVar1 << 2);
  *__s->pClauses = piVar8;
  __s->pClauses[iVar2] = *__s->pClauses + iVar1;
  iVar3 = Aig_ManObjNumMax(p);
  piVar8 = (int *)malloc((long)iVar3 << 2);
  __s->pVarNums = piVar8;
  for (nClauses = 0; iVar3 = Aig_ManObjNumMax(p), nClauses < iVar3; nClauses = nClauses + 1) {
    __s->pVarNums[nClauses] = -1;
  }
  local_d8 = 1;
  if (nOutputs != 0) {
    for (nClauses = 0; iVar3 = Vec_PtrSize(p->vCos), nClauses < iVar3; nClauses = nClauses + 1) {
      pvVar9 = Vec_PtrEntry(p->vCos,nClauses);
      __s->pVarNums[*(int *)((long)pvVar9 + 0x24)] = local_d8;
      local_d8 = local_d8 + 1;
    }
  }
  for (nClauses = 0; iVar3 = Vec_PtrSize(p->vObjs), nClauses < iVar3; nClauses = nClauses + 1) {
    pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,nClauses);
    if ((pAVar10 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar10), iVar3 != 0)) {
      __s->pVarNums[pAVar10->Id] = local_d8;
      local_d8 = local_d8 + 1;
    }
  }
  for (nClauses = 0; iVar3 = Vec_PtrSize(p->vCis), nClauses < iVar3; nClauses = nClauses + 1) {
    pvVar9 = Vec_PtrEntry(p->vCis,nClauses);
    __s->pVarNums[*(int *)((long)pvVar9 + 0x24)] = local_d8;
    local_d8 = local_d8 + 1;
  }
  piVar8 = __s->pVarNums;
  pAVar10 = Aig_ManConst1(p);
  piVar8[pAVar10->Id] = local_d8;
  __s->nVars = local_d8 + 1;
  pClas = (int **)*__s->pClauses;
  _nLiterals = __s->pClauses;
  for (nClauses = 0; iVar3 = Vec_PtrSize(p->vObjs), nClauses < iVar3; nClauses = nClauses + 1) {
    pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,nClauses);
    if ((pAVar10 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar10), iVar3 != 0)) {
      iVar3 = __s->pVarNums[pAVar10->Id];
      piVar8 = __s->pVarNums;
      pAVar11 = Aig_ObjFanin0(pAVar10);
      iVar5 = piVar8[pAVar11->Id];
      piVar8 = __s->pVarNums;
      pAVar11 = Aig_ObjFanin1(pAVar10);
      iVar6 = piVar8[pAVar11->Id];
      *_nLiterals = (int *)pClas;
      *(int *)pClas = iVar3 << 1;
      iVar4 = Aig_ObjFaninC0(pAVar10);
      *(uint *)((long)pClas + 4) = iVar5 * 2 + (uint)((iVar4 != 0 ^ 0xffU) & 1);
      iVar4 = Aig_ObjFaninC1(pAVar10);
      *(uint *)(pClas + 1) = iVar6 * 2 + (uint)((iVar4 != 0 ^ 0xffU) & 1);
      ppiVar7 = _nLiterals + 2;
      _nLiterals[1] = (int *)((long)pClas + 0xc);
      *(int *)((long)pClas + 0xc) = iVar3 * 2 + 1;
      iVar4 = Aig_ObjFaninC0(pAVar10);
      *(int *)(pClas + 2) = iVar5 * 2 + iVar4;
      _nLiterals = _nLiterals + 3;
      *ppiVar7 = (int *)((long)pClas + 0x14);
      ppiVar7 = pClas + 3;
      *(int *)((long)pClas + 0x14) = iVar3 * 2 + 1;
      iVar3 = Aig_ObjFaninC1(pAVar10);
      pClas = (int **)((long)pClas + 0x1c);
      *(int *)ppiVar7 = iVar6 * 2 + iVar3;
    }
  }
  piVar8 = __s->pVarNums;
  pAVar10 = Aig_ManConst1(p);
  iVar3 = piVar8[pAVar10->Id];
  iVar5 = Aig_ManObjNumMax(p);
  if (iVar5 < iVar3) {
    __assert_fail("OutVar <= Aig_ManObjNumMax(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                  ,0x297,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
  }
  *_nLiterals = (int *)pClas;
  *(int *)pClas = iVar3 << 1;
  _nLiterals = _nLiterals + 1;
  pClas = (int **)((long)pClas + 4);
  for (nClauses = 0; iVar3 = Vec_PtrSize(p->vCos), nClauses < iVar3; nClauses = nClauses + 1) {
    pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,nClauses);
    piVar8 = __s->pVarNums;
    pAVar11 = Aig_ObjFanin0(pAVar10);
    iVar3 = piVar8[pAVar11->Id];
    iVar5 = Aig_ManCoNum(p);
    if (nClauses < iVar5 - nOutputs) {
      *_nLiterals = (int *)pClas;
      iVar5 = Aig_ObjFaninC0(pAVar10);
      *(int *)pClas = iVar3 * 2 + iVar5;
      _nLiterals = _nLiterals + 1;
      pClas = (int **)((long)pClas + 4);
    }
    else {
      iVar5 = __s->pVarNums[pAVar10->Id];
      ppiVar7 = _nLiterals + 1;
      *_nLiterals = (int *)pClas;
      *(int *)pClas = iVar5 << 1;
      iVar6 = Aig_ObjFaninC0(pAVar10);
      *(uint *)((long)pClas + 4) = iVar3 * 2 + (uint)((iVar6 != 0 ^ 0xffU) & 1);
      _nLiterals = _nLiterals + 2;
      *ppiVar7 = (int *)(pClas + 1);
      piVar8 = (int *)((long)pClas + 0xc);
      *(int *)(pClas + 1) = iVar5 * 2 + 1;
      iVar5 = Aig_ObjFaninC0(pAVar10);
      pClas = pClas + 2;
      *piVar8 = iVar3 * 2 + iVar5;
    }
  }
  if ((long)pClas - (long)*__s->pClauses >> 2 == (long)iVar1) {
    if ((long)_nLiterals - (long)__s->pClauses >> 3 == (long)iVar2) {
      return __s;
    }
    __assert_fail("pClas - pCnf->pClauses == nClauses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                  ,0x2b4,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
  }
  __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                ,0x2b3,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
}

Assistant:

Cnf_Dat_t * Cnf_DeriveSimple( Aig_Man_t * p, int nOutputs )
{
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    int i, nLiterals, nClauses, Number;

    // count the number of literals and clauses
    nLiterals = 1 + 7 * Aig_ManNodeNum(p) + Aig_ManCoNum( p ) + 3 * nOutputs;
    nClauses = 1 + 3 * Aig_ManNodeNum(p) + Aig_ManCoNum( p ) + nOutputs;

    // allocate CNF
    pCnf = ABC_ALLOC( Cnf_Dat_t, 1 );
    memset( pCnf, 0, sizeof(Cnf_Dat_t) );
    pCnf->pMan = p;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses = nClauses;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;

    // create room for variable numbers
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(p) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(p) );
    for ( i = 0; i < Aig_ManObjNumMax(p); i++ )
        pCnf->pVarNums[i] = -1;
    // assign variables to the last (nOutputs) POs
    Number = 1;
    if ( nOutputs )
    {
//        assert( nOutputs == Aig_ManRegNum(p) );
//        Aig_ManForEachLiSeq( p, pObj, i )
//            pCnf->pVarNums[pObj->Id] = Number++;
        Aig_ManForEachCo( p, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
    }
    // assign variables to the internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    // assign variables to the PIs and constant node
    Aig_ManForEachCi( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    pCnf->pVarNums[Aig_ManConst1(p)->Id] = Number++;
    pCnf->nVars = Number;
/*
    // print CNF numbers
    printf( "SAT numbers of each node:\n" );
    Aig_ManForEachObj( p, pObj, i )
        printf( "%d=%d ", pObj->Id, pCnf->pVarNums[pObj->Id] );
    printf( "\n" );
*/
    // assign the clauses
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Aig_ManForEachNode( p, pObj, i )
    {
        OutVar   = pCnf->pVarNums[ pObj->Id ];
        pVars[0] = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        pVars[1] = pCnf->pVarNums[ Aig_ObjFanin1(pObj)->Id ];

        // positive phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar; 
        *pLits++ = 2 * pVars[0] + !Aig_ObjFaninC0(pObj); 
        *pLits++ = 2 * pVars[1] + !Aig_ObjFaninC1(pObj); 
        // negative phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[0] + Aig_ObjFaninC0(pObj); 
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[1] + Aig_ObjFaninC1(pObj); 
    }
 
    // write the constant literal
    OutVar = pCnf->pVarNums[ Aig_ManConst1(p)->Id ];
    assert( OutVar <= Aig_ManObjNumMax(p) );
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar;  

    // write the output literals
    Aig_ManForEachCo( p, pObj, i )
    {
        OutVar = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        if ( i < Aig_ManCoNum(p) - nOutputs )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
        else
        {
            PoVar  = pCnf->pVarNums[ pObj->Id ];
            // first clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar; 
            *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
            // second clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar + 1; 
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
    }

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
    return pCnf;
}